

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RotationZ.cpp
# Opt level: O2

void __thiscall
qclab::qgates::RotationZ<std::complex<float>_>::apply
          (RotationZ<std::complex<float>_> *this,Op op,int nbQubits,
          vector<std::complex<float>,_std::allocator<std::complex<float>_>_> *vector,int offset)

{
  int iVar1;
  anon_class_24_3_f49331b9 f;
  undefined1 local_40 [12];
  float local_34;
  float local_30;
  float local_2c;
  
  iVar1 = (*(this->super_QRotationGate1<std::complex<float>_>).super_QGate1<std::complex<float>_>.
            super_QObject<std::complex<float>_>._vptr_QObject[3])();
  local_40._8_4_ = (this->super_QRotationGate1<std::complex<float>_>).rotation_.angle_.cos_;
  local_34 = (this->super_QRotationGate1<std::complex<float>_>).rotation_.angle_.sin_;
  local_40._0_8_ = *(undefined8 *)vector;
  local_2c = -local_34;
  if (op != ConjTrans) {
    local_2c = local_34;
    local_34 = -local_34;
  }
  local_30 = (float)local_40._8_4_;
  apply2<qclab::qgates::lambda_RotationZ<std::complex<float>,float>(qclab::Op,float,float,std::complex<float>*)::_lambda(unsigned_long,unsigned_long)_1_>
            (nbQubits,iVar1 + offset,(anon_class_24_3_f49331b9 *)local_40);
  return;
}

Assistant:

void RotationZ< T >::apply( Op op , const int nbQubits ,
                              std::vector< T >& vector ,
                              const int offset ) const {
    const int qubit = this->qubit() + offset ;
    auto f = lambda_RotationZ( op , this->cos() , this->sin() , vector.data() );
    apply2( nbQubits , qubit , f ) ;
  }